

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  int iVar1;
  uint uVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int32_t iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  int iVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint *puVar21;
  long lVar22;
  int *piVar23;
  byte bVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  ulong local_288;
  cpp_dec_float<200U,_int,_void> local_248;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar24 = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  pnVar4 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->l).idx;
  piVar6 = (this->l).row;
  piVar7 = (this->l).start;
  local_288 = (ulong)(this->l).firstUpdate;
  if ((long)local_288 < 1) {
    local_288 = 0;
  }
  else {
    local_1c0 = this;
    uVar11 = 0;
    do {
      iVar9 = piVar6[uVar11];
      pnVar15 = vec + iVar9;
      pcVar13 = &local_138;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar24 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar24 * -8 + 4);
      }
      local_138.exp = vec[iVar9].m_backend.exp;
      local_138.neg = vec[iVar9].m_backend.neg;
      fVar3 = vec[iVar9].m_backend.fpclass;
      iVar8 = vec[iVar9].m_backend.prec_elem;
      local_138.fpclass = fVar3;
      local_138.prec_elem = iVar8;
      if (fVar3 == cpp_dec_float_NaN) {
LAB_00531b2c:
        iVar9 = piVar7[uVar11];
        iVar14 = piVar7[uVar11 + 1];
        if (iVar9 < iVar14) {
          pcVar13 = &pnVar4[iVar9].m_backend;
          piVar23 = piVar5 + iVar9;
          do {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x1c;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems[0xe] = 0;
            local_248.data._M_elems[0xf] = 0;
            local_248.data._M_elems[0x10] = 0;
            local_248.data._M_elems[0x11] = 0;
            local_248.data._M_elems[0x12] = 0;
            local_248.data._M_elems[0x13] = 0;
            local_248.data._M_elems[0x14] = 0;
            local_248.data._M_elems[0x15] = 0;
            local_248.data._M_elems[0x16] = 0;
            local_248.data._M_elems[0x17] = 0;
            local_248.data._M_elems[0x18] = 0;
            local_248.data._M_elems[0x19] = 0;
            local_248.data._M_elems._104_5_ = 0;
            local_248.data._M_elems[0x1b]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            pcVar16 = &local_138;
            if (pcVar13 != &local_248) {
              pcVar19 = &local_248;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4)
                ;
              }
              local_248.exp = local_138.exp;
              local_248.neg = local_138.neg;
              local_248.fpclass = local_138.fpclass;
              local_248.prec_elem = local_138.prec_elem;
              pcVar16 = pcVar13;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_248,pcVar16);
            iVar1 = *piVar23;
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar16 = &local_138;
            if (pcVar13 != &local_b8) {
              pcVar19 = &local_b8;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4)
                ;
              }
              local_b8.exp = local_138.exp;
              local_b8.neg = local_138.neg;
              local_b8.fpclass = local_138.fpclass;
              local_b8.prec_elem = local_138.prec_elem;
              pcVar16 = pcVar13;
            }
            pcVar19 = &vec[iVar1].m_backend;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_b8,pcVar16);
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x1c;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems[0xe] = 0;
            local_1b8.data._M_elems[0xf] = 0;
            local_1b8.data._M_elems[0x10] = 0;
            local_1b8.data._M_elems[0x11] = 0;
            local_1b8.data._M_elems[0x12] = 0;
            local_1b8.data._M_elems[0x13] = 0;
            local_1b8.data._M_elems[0x14] = 0;
            local_1b8.data._M_elems[0x15] = 0;
            local_1b8.data._M_elems[0x16] = 0;
            local_1b8.data._M_elems[0x17] = 0;
            local_1b8.data._M_elems[0x18] = 0;
            local_1b8.data._M_elems[0x19] = 0;
            local_1b8.data._M_elems._104_5_ = 0;
            local_1b8.data._M_elems[0x1b]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            if (&local_1b8 != pcVar19) {
              pcVar16 = pcVar19;
              pcVar17 = &local_1b8;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4)
                ;
              }
              local_1b8.exp = pcVar19->exp;
              local_1b8.neg = pcVar19->neg;
              local_1b8.fpclass = pcVar19->fpclass;
              local_1b8.prec_elem = pcVar19->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_1b8,&local_b8);
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x1c;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems[0xe] = 0;
            local_248.data._M_elems[0xf] = 0;
            local_248.data._M_elems[0x10] = 0;
            local_248.data._M_elems[0x11] = 0;
            local_248.data._M_elems[0x12] = 0;
            local_248.data._M_elems[0x13] = 0;
            local_248.data._M_elems[0x14] = 0;
            local_248.data._M_elems[0x15] = 0;
            local_248.data._M_elems[0x16] = 0;
            local_248.data._M_elems[0x17] = 0;
            local_248.data._M_elems[0x18] = 0;
            local_248.data._M_elems[0x19] = 0;
            local_248.data._M_elems._104_5_ = 0;
            local_248.data._M_elems[0x1b]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            pcVar16 = &local_138;
            if (pcVar13 != &local_248) {
              pcVar19 = &local_248;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4)
                ;
              }
              local_248.exp = local_138.exp;
              local_248.neg = local_138.neg;
              local_248.fpclass = local_138.fpclass;
              local_248.prec_elem = local_138.prec_elem;
              pcVar16 = pcVar13;
            }
            pcVar13 = pcVar13 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_248,pcVar16);
            iVar1 = *piVar23;
            piVar23 = piVar23 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[iVar1].m_backend,&local_248);
            iVar14 = iVar14 + -1;
          } while (iVar9 < iVar14);
        }
      }
      else {
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 0x1c;
        local_248.data._M_elems[0] = 0;
        local_248.data._M_elems[1] = 0;
        local_248.data._M_elems[2] = 0;
        local_248.data._M_elems[3] = 0;
        local_248.data._M_elems[4] = 0;
        local_248.data._M_elems[5] = 0;
        local_248.data._M_elems[6] = 0;
        local_248.data._M_elems[7] = 0;
        local_248.data._M_elems[8] = 0;
        local_248.data._M_elems[9] = 0;
        local_248.data._M_elems[10] = 0;
        local_248.data._M_elems[0xb] = 0;
        local_248.data._M_elems[0xc] = 0;
        local_248.data._M_elems[0xd] = 0;
        local_248.data._M_elems[0xe] = 0;
        local_248.data._M_elems[0xf] = 0;
        local_248.data._M_elems[0x10] = 0;
        local_248.data._M_elems[0x11] = 0;
        local_248.data._M_elems[0x12] = 0;
        local_248.data._M_elems[0x13] = 0;
        local_248.data._M_elems[0x14] = 0;
        local_248.data._M_elems[0x15] = 0;
        local_248.data._M_elems[0x16] = 0;
        local_248.data._M_elems[0x17] = 0;
        local_248.data._M_elems[0x18] = 0;
        local_248.data._M_elems[0x19] = 0;
        local_248.data._M_elems._104_5_ = 0;
        local_248.data._M_elems[0x1b]._1_3_ = 0;
        local_248.exp = 0;
        local_248.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_248,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_138,&local_248);
        if (iVar9 != 0) goto LAB_00531b2c;
      }
      uVar11 = uVar11 + 1;
      this = local_1c0;
    } while (uVar11 != local_288);
  }
  if ((this->l).updateType != 0) {
    uVar2 = (this->l).firstUnused;
    if ((int)local_288 < (int)uVar2) {
      local_288 = local_288 & 0xffffffff;
      do {
        iVar9 = piVar7[local_288];
        lVar22 = (long)piVar6[local_288];
        pnVar15 = vec + lVar22;
        uVar12 = (pnVar15->m_backend).data._M_elems[0];
        puVar18 = (pnVar15->m_backend).data._M_elems + 1;
        puVar21 = local_248.data._M_elems + 1;
        for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar21 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
        }
        local_248.exp = (pnVar15->m_backend).exp;
        local_248.fpclass = (pnVar15->m_backend).fpclass;
        local_248.neg =
             (bool)((uVar12 != 0 || local_248.fpclass != cpp_dec_float_finite) ^
                   (pnVar15->m_backend).neg);
        local_248.prec_elem = (pnVar15->m_backend).prec_elem;
        local_248.data._M_elems[0] = uVar12;
        iVar14 = piVar7[local_288 + 1];
        if (iVar9 < iVar14) {
          pcVar13 = &pnVar4[iVar9].m_backend;
          piVar23 = piVar5 + iVar9;
          do {
            pcVar19 = &vec[*piVar23].m_backend;
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x1c;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems[0xe] = 0;
            local_1b8.data._M_elems[0xf] = 0;
            local_1b8.data._M_elems[0x10] = 0;
            local_1b8.data._M_elems[0x11] = 0;
            local_1b8.data._M_elems[0x12] = 0;
            local_1b8.data._M_elems[0x13] = 0;
            local_1b8.data._M_elems[0x14] = 0;
            local_1b8.data._M_elems[0x15] = 0;
            local_1b8.data._M_elems[0x16] = 0;
            local_1b8.data._M_elems[0x17] = 0;
            local_1b8.data._M_elems[0x18] = 0;
            local_1b8.data._M_elems[0x19] = 0;
            local_1b8.data._M_elems._104_5_ = 0;
            local_1b8.data._M_elems[0x1b]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            pcVar16 = pcVar19;
            if ((pcVar13 != &local_1b8) && (pcVar16 = pcVar13, &local_1b8 != pcVar19)) {
              pcVar17 = pcVar19;
              pcVar20 = &local_1b8;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar24 * -8 + 4)
                ;
              }
              local_1b8.exp = pcVar19->exp;
              local_1b8.neg = pcVar19->neg;
              local_1b8.fpclass = pcVar19->fpclass;
              local_1b8.prec_elem = pcVar19->prec_elem;
            }
            piVar23 = piVar23 + 1;
            pcVar13 = pcVar13 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_1b8,pcVar16);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&local_248,&local_1b8);
            iVar14 = iVar14 + -1;
          } while (iVar9 < iVar14);
          lVar22 = (long)piVar6[local_288];
          uVar12 = local_248.data._M_elems[0];
        }
        local_288 = local_288 + 1;
        pnVar15 = vec + lVar22;
        (pnVar15->m_backend).data._M_elems[0] = uVar12;
        puVar18 = local_248.data._M_elems + 1;
        puVar21 = (pnVar15->m_backend).data._M_elems + 1;
        for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar21 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
        }
        (pnVar15->m_backend).exp = local_248.exp;
        (pnVar15->m_backend).neg =
             (bool)((local_248.fpclass != cpp_dec_float_finite || uVar12 != 0) ^ local_248.neg);
        (pnVar15->m_backend).fpclass = local_248.fpclass;
        (pnVar15->m_backend).prec_elem = local_248.prec_elem;
      } while (local_288 != uVar2);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}